

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emulator.c
# Opt level: O1

void trigger_nrx4_envelope(Emulator *e,Envelope *envelope,Address addr)

{
  uint uVar1;
  uint uVar2;
  char *pcVar3;
  char *pcVar4;
  
  envelope->volume = envelope->initial_volume;
  uVar1._0_1_ = envelope->period;
  uVar1._1_1_ = envelope->volume;
  uVar1._2_2_ = *(undefined2 *)&envelope->field_0xa;
  uVar2 = 8;
  if ((undefined1)uVar1 != '\0') {
    uVar2 = uVar1;
  }
  envelope->timer = uVar2 & 0xff;
  envelope->automatic = TRUE;
  if ((e->state).apu.frame == '\x06') {
    envelope->timer = (uVar2 & 0xff) + 1;
  }
  pcVar4 = "unknown";
  if (addr < 0x17) {
    pcVar4 = *(char **)(get_apu_reg_string_s_strings + (ulong)addr * 8);
  }
  pcVar3 = "unknown";
  if (pcVar4 != (char *)0x0) {
    pcVar3 = pcVar4;
  }
  HOOK_trigger_nrx4_info_asii
            (e,(char *)envelope,(ulong)addr,pcVar3,(ulong)envelope->initial_volume,
             (ulong)envelope->timer);
  return;
}

Assistant:

static void trigger_nrx4_envelope(Emulator* e, Envelope* envelope,
                                  Address addr) {
  envelope->volume = envelope->initial_volume;
  envelope->timer = envelope->period ? envelope->period : ENVELOPE_MAX_PERIOD;
  envelope->automatic = TRUE;
  /* If the next APU frame will update the envelope, increment the timer. */
  if (UNLIKELY(APU.frame + 1 == FRAME_SEQUENCER_UPDATE_ENVELOPE_FRAME)) {
    envelope->timer++;
  }
  HOOK(trigger_nrx4_info_asii, addr, get_apu_reg_string(addr), envelope->volume,
       envelope->timer);
}